

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_tree.c
# Opt level: O0

void expandSeeds(tree_t *tree,uint8_t *salt,uint repIndex,picnic_instance_t *params)

{
  _Bool _Var1;
  uint uVar2;
  ulong __n;
  long in_RCX;
  tree_t *in_RDI;
  uint j;
  uint i;
  uint lastNonLeaf;
  uint8_t *tmp_ptr [4];
  uint8_t tmp [256];
  size_t seed_size;
  uint in_stack_000001e4;
  uint in_stack_000001e8;
  uint8_t in_stack_000001ef;
  uint8_t *in_stack_000001f0;
  tree_t *in_stack_000001f8;
  uint8_t **in_stack_00000200;
  picnic_instance_t *in_stack_00000210;
  long in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffea0;
  uint uVar3;
  uint local_154;
  uint local_150;
  undefined1 *local_148 [4];
  undefined1 local_128 [64];
  undefined1 auStack_e8 [64];
  undefined1 auStack_a8 [28];
  uint in_stack_ffffffffffffff74;
  uint in_stack_ffffffffffffff78;
  uint8_t in_stack_ffffffffffffff7f;
  uint8_t *in_stack_ffffffffffffff80;
  uint8_t *in_stack_ffffffffffffff88;
  uint8_t *in_stack_ffffffffffffff90;
  undefined1 auStack_68 [8];
  picnic_instance_t *in_stack_ffffffffffffffa0;
  
  __n = (ulong)*(byte *)(in_RCX + 7);
  local_148[0] = local_128;
  local_148[1] = auStack_e8;
  local_148[2] = auStack_a8;
  local_148[3] = auStack_68;
  uVar2 = getParent(in_RDI->numNodes - 1);
  local_150 = 0;
  while( true ) {
    uVar3 = uVar2;
    if (2 < uVar2) {
      uVar3 = 2;
    }
    if (uVar3 < local_150) break;
    _Var1 = haveNode((tree_t *)CONCAT44(uVar3,in_stack_fffffffffffffea0),
                     (uint)((ulong)in_stack_fffffffffffffe98 >> 0x20));
    if (_Var1) {
      in_stack_fffffffffffffe98 = in_RCX;
      hashSeed(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
               in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
               in_stack_ffffffffffffffa0);
      _Var1 = haveNode((tree_t *)CONCAT44(uVar3,in_stack_fffffffffffffea0),
                       (uint)((ulong)in_stack_fffffffffffffe98 >> 0x20));
      if (!_Var1) {
        memcpy(in_RDI->nodes + (local_150 * 2 + 1) * __n,local_128,__n);
        markNode((tree_t *)CONCAT44(uVar3,in_stack_fffffffffffffea0),
                 (uint)((ulong)in_stack_fffffffffffffe98 >> 0x20));
      }
      _Var1 = existsNotHaveNode(in_RDI,local_150 * 2 + 2);
      if (_Var1) {
        memcpy(in_RDI->nodes + (local_150 * 2 + 2) * __n,local_128 + __n,__n);
        markNode((tree_t *)CONCAT44(uVar3,in_stack_fffffffffffffea0),
                 (uint)((ulong)in_stack_fffffffffffffe98 >> 0x20));
      }
    }
    local_150 = local_150 + 1;
  }
  for (; local_150 <= (uVar2 & 0xfffffffc); local_150 = local_150 + 4) {
    in_stack_fffffffffffffe98 = in_RCX;
    hashSeed_x4(in_stack_00000200,in_stack_000001f8,in_stack_000001f0,in_stack_000001ef,
                in_stack_000001e8,in_stack_000001e4,in_stack_00000210);
    for (local_154 = local_150; local_154 < local_150 + 4; local_154 = local_154 + 1) {
      _Var1 = haveNode((tree_t *)CONCAT44(uVar3,in_stack_fffffffffffffea0),
                       (uint)((ulong)in_stack_fffffffffffffe98 >> 0x20));
      if (_Var1) {
        _Var1 = haveNode((tree_t *)CONCAT44(uVar3,in_stack_fffffffffffffea0),
                         (uint)((ulong)in_stack_fffffffffffffe98 >> 0x20));
        if (!_Var1) {
          memcpy(in_RDI->nodes + (local_154 * 2 + 1) * __n,local_148[local_154 - local_150],__n);
          markNode((tree_t *)CONCAT44(uVar3,in_stack_fffffffffffffea0),
                   (uint)((ulong)in_stack_fffffffffffffe98 >> 0x20));
        }
        _Var1 = existsNotHaveNode(in_RDI,local_154 * 2 + 2);
        if (_Var1) {
          memcpy(in_RDI->nodes + (local_154 * 2 + 2) * __n,local_148[local_154 - local_150] + __n,
                 __n);
          markNode((tree_t *)CONCAT44(uVar3,in_stack_fffffffffffffea0),
                   (uint)((ulong)in_stack_fffffffffffffe98 >> 0x20));
        }
      }
    }
  }
  for (; local_150 <= uVar2; local_150 = local_150 + 1) {
    _Var1 = haveNode((tree_t *)CONCAT44(uVar3,in_stack_fffffffffffffea0),
                     (uint)((ulong)in_stack_fffffffffffffe98 >> 0x20));
    if (_Var1) {
      in_stack_fffffffffffffe98 = in_RCX;
      hashSeed(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
               in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
               in_stack_ffffffffffffffa0);
      _Var1 = haveNode((tree_t *)CONCAT44(uVar3,in_stack_fffffffffffffea0),
                       (uint)((ulong)in_stack_fffffffffffffe98 >> 0x20));
      if (!_Var1) {
        memcpy(in_RDI->nodes + (local_150 * 2 + 1) * __n,local_128,__n);
        markNode((tree_t *)CONCAT44(uVar3,in_stack_fffffffffffffea0),
                 (uint)((ulong)in_stack_fffffffffffffe98 >> 0x20));
      }
      _Var1 = existsNotHaveNode(in_RDI,local_150 * 2 + 2);
      if (_Var1) {
        memcpy(in_RDI->nodes + (local_150 * 2 + 2) * __n,local_128 + __n,__n);
        markNode((tree_t *)CONCAT44(uVar3,in_stack_fffffffffffffea0),
                 (uint)((ulong)in_stack_fffffffffffffe98 >> 0x20));
      }
    }
  }
  return;
}

Assistant:

static void expandSeeds(tree_t* tree, uint8_t* salt, unsigned int repIndex,
                        const picnic_instance_t* params) {
  const size_t seed_size = params->seed_size;

  uint8_t tmp[4 * 2 * MAX_SEED_SIZE_BYTES];
  uint8_t* tmp_ptr[4] = {&tmp[0], &tmp[2 * MAX_SEED_SIZE_BYTES], &tmp[2 * 2 * MAX_SEED_SIZE_BYTES],
                         &tmp[3 * 2 * MAX_SEED_SIZE_BYTES]};

  /* Walk the tree, expanding seeds where possible. Compute children of
   * non-leaf nodes. */
  const unsigned int lastNonLeaf = getParent(tree->numNodes - 1);
  unsigned int i                 = 0;
  /* expand the first 4 seeds*/
  for (; i <= MIN(2, lastNonLeaf); i++) {
    if (!haveNode(tree, i)) {
      continue;
    }

    hashSeed(tmp, &tree->nodes[i * seed_size], salt, HASH_PREFIX_1, repIndex, i, params);

    if (!haveNode(tree, 2 * i + 1)) {
      /* left child = H_left(seed_i || salt || t || i) */
      memcpy(&tree->nodes[(2 * i + 1) * seed_size], tmp, seed_size);
      markNode(tree, 2 * i + 1);
    }

    /* The last non-leaf node will only have a left child when there are an odd number of leaves */
    if (existsNotHaveNode(tree, 2 * i + 2)) {
      /* right child = H_right(seed_i || salt || t || i)  */
      memcpy(&tree->nodes[(2 * i + 2) * seed_size], tmp + seed_size, seed_size);
      markNode(tree, 2 * i + 2);
    }
  }
  /* now hash in groups of 4 for faster hashing */
  for (; i <= lastNonLeaf / 4 * 4; i += 4) {
    hashSeed_x4(tmp_ptr, tree, salt, HASH_PREFIX_1, repIndex, i, params);

    for (unsigned int j = i; j < i + 4; j++) {
      if (!haveNode(tree, j)) {
        continue;
      }
      if (!haveNode(tree, 2 * j + 1)) {
        /* left child = H_left(seed_i || salt || t || j) */
        memcpy(&tree->nodes[(2 * j + 1) * seed_size], tmp_ptr[j - i], seed_size);
        markNode(tree, 2 * j + 1);
      }

      /* The last non-leaf node will only have a left child when there are an odd number of leaves
       */
      if (existsNotHaveNode(tree, 2 * j + 2)) {
        /* right child = H_right(seed_i || salt || t || j)  */
        memcpy(&tree->nodes[(2 * j + 2) * seed_size], tmp_ptr[j - i] + seed_size, seed_size);
        markNode(tree, 2 * j + 2);
      }
    }
  }
  /* handle last few, which are not a multiple of 4 */
  for (; i <= lastNonLeaf; i++) {
    if (!haveNode(tree, i)) {
      continue;
    }

    hashSeed(tmp, &tree->nodes[i * seed_size], salt, HASH_PREFIX_1, repIndex, i, params);

    if (!haveNode(tree, 2 * i + 1)) {
      /* left child = H_left(seed_i || salt || t || i) */
      memcpy(&tree->nodes[(2 * i + 1) * seed_size], tmp, seed_size);
      markNode(tree, 2 * i + 1);
    }

    /* The last non-leaf node will only have a left child when there are an odd number of leaves */
    if (existsNotHaveNode(tree, 2 * i + 2)) {
      /* right child = H_right(seed_i || salt || t || i)  */
      memcpy(&tree->nodes[(2 * i + 2) * seed_size], tmp + seed_size, seed_size);
      markNode(tree, 2 * i + 2);
    }
  }
}